

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall kj::Array<const_unsigned_int>::~Array(Array<const_unsigned_int> *this)

{
  uint *puVar1;
  size_t sVar2;
  
  puVar1 = this->ptr;
  if (puVar1 != (uint *)0x0) {
    sVar2 = this->size_;
    this->ptr = (uint *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,puVar1,4,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }